

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O2

int crypt_init_chacha20_poly
              (LIBSSH2_SESSION *session,LIBSSH2_CRYPT_METHOD *method,uchar *iv,int *free_iv,
              uchar *secret,int *free_secret,int encrypt,void **abstract)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = (int *)(*session->alloc)(0x98,&session->abstract);
  if (piVar2 == (int *)0x0) {
    iVar1 = -6;
  }
  else {
    *piVar2 = encrypt;
    *(_func_EVP_CIPHER_ptr **)(piVar2 + 2) = method->algo;
    iVar1 = chachapoly_init((chachapoly_ctx *)(piVar2 + 6),secret,method->secret_len);
    if (iVar1 == 0) {
      *abstract = piVar2;
      *free_iv = 1;
      *free_secret = 1;
      iVar1 = 0;
    }
    else {
      (*session->free)(piVar2,&session->abstract);
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int
crypt_init_chacha20_poly(LIBSSH2_SESSION * session,
           const LIBSSH2_CRYPT_METHOD * method,
           unsigned char *iv, int *free_iv,
           unsigned char *secret, int *free_secret,
           int encrypt, void **abstract)
{
    struct crypt_ctx *ctx = LIBSSH2_ALLOC(session,
                                          sizeof(struct crypt_ctx));

    (void)iv;

    if(!ctx)
        return LIBSSH2_ERROR_ALLOC;

    ctx->encrypt = encrypt;
    ctx->algo = method->algo;

    if(chachapoly_init(&ctx->chachapoly_ctx, secret, method->secret_len)) {
        LIBSSH2_FREE(session, ctx);
        return -1;
    }

    *abstract = ctx;
    *free_iv = 1;
    *free_secret = 1;
    return 0;
}